

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O1

bool q_hasEglExtension(EGLDisplay display,char *extensionName)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  undefined7 extraout_var;
  long lVar5;
  QByteArray *lhs;
  long lVar6;
  long in_FS_OFFSET;
  QByteArray local_60;
  QArrayDataPointer<QByteArray> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d._0_4_ = 0xaaaaaaaa;
  local_48.d._4_4_ = 0xaaaaaaaa;
  local_48.ptr._0_4_ = 0xaaaaaaaa;
  local_48.ptr._4_4_ = 0xaaaaaaaa;
  local_30 = extensionName;
  pcVar3 = (char *)eglQueryString(display,0x3055);
  QByteArray::QByteArray(&local_60,pcVar3,-1);
  QByteArray::split((char)&local_48);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    lhs = (QByteArray *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
    lVar6 = 0x18 - (long)lhs;
    lVar4 = local_48.size * 8;
    lVar1 = local_48.size * 0x18;
    do {
      lVar5 = lVar1;
      if (lVar5 == 0) goto LAB_0058b47b;
      bVar2 = operator==(lhs,&local_30);
      lVar4 = CONCAT71(extraout_var,bVar2);
      lVar6 = lVar6 + -0x18;
      lhs = lhs + 1;
      lVar1 = lVar5 + -0x18;
    } while (!bVar2);
    lVar4 = (-(lVar6 + CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_)) >> 3) * -0x5555555555555555;
LAB_0058b47b:
    if (lVar5 != 0) goto LAB_0058b487;
  }
  lVar4 = -1;
LAB_0058b487:
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return lVar4 != -1;
  }
  __stack_chk_fail();
}

Assistant:

bool q_hasEglExtension(EGLDisplay display, const char* extensionName)
{
    QList<QByteArray> extensions =
        QByteArray(reinterpret_cast<const char *>
            (eglQueryString(display, EGL_EXTENSIONS))).split(' ');
    return extensions.contains(extensionName);
}